

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O1

int __thiscall
jrtplib::RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::
DeleteElement(RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317> *this
             ,in6_addr *elem)

{
  uint uVar1;
  HashElement *pHVar2;
  RTPMemoryManager *pRVar3;
  bool bVar4;
  int iVar5;
  HashElement *pHVar6;
  HashElement *pHVar7;
  undefined1 auVar8 [16];
  
  uVar1 = (elem->__in6_u).__u6_addr32[3];
  pHVar7 = this->table
           [(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) %
            0x207d];
  this->curhashelem = pHVar7;
  bVar4 = false;
  do {
    pHVar6 = pHVar7;
    if (pHVar6 == (HashElement *)0x0) {
      iVar5 = -5;
      goto LAB_00126079;
    }
    auVar8[0] = -((elem->__in6_u).__u6_addr8[0] == (pHVar6->element).__in6_u.__u6_addr8[0]);
    auVar8[1] = -((elem->__in6_u).__u6_addr8[1] == (pHVar6->element).__in6_u.__u6_addr8[1]);
    auVar8[2] = -((elem->__in6_u).__u6_addr8[2] == (pHVar6->element).__in6_u.__u6_addr8[2]);
    auVar8[3] = -((elem->__in6_u).__u6_addr8[3] == (pHVar6->element).__in6_u.__u6_addr8[3]);
    auVar8[4] = -((elem->__in6_u).__u6_addr8[4] == (pHVar6->element).__in6_u.__u6_addr8[4]);
    auVar8[5] = -((elem->__in6_u).__u6_addr8[5] == (pHVar6->element).__in6_u.__u6_addr8[5]);
    auVar8[6] = -((elem->__in6_u).__u6_addr8[6] == (pHVar6->element).__in6_u.__u6_addr8[6]);
    auVar8[7] = -((elem->__in6_u).__u6_addr8[7] == (pHVar6->element).__in6_u.__u6_addr8[7]);
    auVar8[8] = -((elem->__in6_u).__u6_addr8[8] == (pHVar6->element).__in6_u.__u6_addr8[8]);
    auVar8[9] = -((elem->__in6_u).__u6_addr8[9] == (pHVar6->element).__in6_u.__u6_addr8[9]);
    auVar8[10] = -((elem->__in6_u).__u6_addr8[10] == (pHVar6->element).__in6_u.__u6_addr8[10]);
    auVar8[0xb] = -((elem->__in6_u).__u6_addr8[0xb] == (pHVar6->element).__in6_u.__u6_addr8[0xb]);
    auVar8[0xc] = -((elem->__in6_u).__u6_addr8[0xc] == (pHVar6->element).__in6_u.__u6_addr8[0xc]);
    auVar8[0xd] = -((elem->__in6_u).__u6_addr8[0xd] == (pHVar6->element).__in6_u.__u6_addr8[0xd]);
    auVar8[0xe] = -((elem->__in6_u).__u6_addr8[0xe] == (pHVar6->element).__in6_u.__u6_addr8[0xe]);
    auVar8[0xf] = -((elem->__in6_u).__u6_addr8[0xf] == (pHVar6->element).__in6_u.__u6_addr8[0xf]);
    if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf)
        == 0xffff) {
      bVar4 = true;
      pHVar7 = pHVar6;
    }
    else {
      pHVar7 = pHVar6->hashnext;
      this->curhashelem = pHVar7;
    }
  } while (!bVar4);
  iVar5 = 0;
LAB_00126079:
  if (pHVar6 == (HashElement *)0x0) {
    return iVar5;
  }
  pHVar7 = this->curhashelem;
  if (pHVar7 == (HashElement *)0x0) {
    return -7;
  }
  pHVar6 = pHVar7->hashprev;
  pHVar2 = pHVar7->hashnext;
  if (pHVar6 == (HashElement *)0x0) {
    this->table[pHVar7->hashindex] = pHVar2;
    if (pHVar2 == (HashElement *)0x0) goto LAB_001260c3;
    pHVar6 = (HashElement *)0x0;
  }
  else {
    pHVar6->hashnext = pHVar2;
    if (pHVar2 == (HashElement *)0x0) goto LAB_001260c3;
  }
  pHVar2->hashprev = pHVar6;
LAB_001260c3:
  pHVar7 = this->curhashelem;
  pHVar6 = pHVar7->listprev;
  pHVar2 = pHVar7->listnext;
  if (pHVar6 == (HashElement *)0x0) {
    this->firsthashelem = pHVar2;
    if (pHVar2 == (HashElement *)0x0) {
      this->lasthashelem = (HashElement *)0x0;
    }
    else {
      pHVar2->listprev = (HashElement *)0x0;
    }
  }
  else {
    pHVar6->listnext = pHVar2;
    if (pHVar2 == (HashElement *)0x0) {
      this->lasthashelem = pHVar6;
    }
    else {
      pHVar2->listprev = pHVar6;
    }
  }
  pRVar3 = (this->super_RTPMemoryObject).mgr;
  if (pRVar3 == (RTPMemoryManager *)0x0) {
    if (pHVar7 != (HashElement *)0x0) {
      operator_delete(pHVar7,0x38);
    }
  }
  else {
    (**(code **)(*(long *)pRVar3 + 0x18))(pRVar3,pHVar7);
  }
  this->curhashelem = pHVar2;
  return 0;
}

Assistant:

inline int RTPHashTable<Element,GetIndex,hashsize>::DeleteElement(const Element &elem)
{
	int status;

	status = GotoElement(elem);
	if (status < 0)
		return status;
	return DeleteCurrentElement();
}